

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcMaj3.c
# Opt level: O2

Vec_Wrd_t * Maj3_ManTruthTables(Maj3_Man_t *p)

{
  int iVar1;
  Vec_Wrd_t *pVVar2;
  word *pwVar3;
  int v;
  uint uVar4;
  uint uVar5;
  
  pVVar2 = Vec_WrdStart((p->nObjs + 1) * p->nWords);
  p->vInfo = pVVar2;
  iVar1 = p->nVars;
  uVar4 = 1 << ((byte)iVar1 & 0x1f);
  for (v = 0; v < iVar1; v = v + 1) {
    pwVar3 = Maj3_ManTruth(p,v);
    Abc_TtIthVar(pwVar3,v,p->nVars);
    iVar1 = p->nVars;
  }
  uVar5 = 0x40;
  if (0x40 < (int)uVar4) {
    uVar5 = uVar4;
  }
  for (uVar4 = 0; uVar5 != uVar4; uVar4 = uVar4 + 1) {
    iVar1 = Maj3_ManValue(uVar4,p->nVars);
    if (iVar1 != 0) {
      pwVar3 = Maj3_ManTruth(p,p->nObjs);
      pwVar3[uVar4 >> 6] = pwVar3[uVar4 >> 6] | 1L << ((byte)uVar4 & 0x3f);
    }
  }
  return pVVar2;
}

Assistant:

Vec_Wrd_t * Maj3_ManTruthTables( Maj3_Man_t * p )
{
    Vec_Wrd_t * vInfo = p->vInfo = Vec_WrdStart( p->nWords * (p->nObjs + 1) ); 
    int i, nMints = Abc_MaxInt( 64, 1 << p->nVars );
    for ( i = 0; i < p->nVars; i++ )
        Abc_TtIthVar( Maj3_ManTruth(p, i), i, p->nVars );
    for ( i = 0; i < nMints; i++ )
        if ( Maj3_ManValue(i, p->nVars) )
            Abc_TtSetBit( Maj3_ManTruth(p, p->nObjs), i );
    //Dau_DsdPrintFromTruth( Maj3_ManTruth(p, p->nObjs), p->nVars );
    return vInfo;
}